

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O3

void FileStream_Close(TFileStream *pStream)

{
  STREAM_CLOSE p_Var1;
  
  if (pStream != (TFileStream *)0x0) {
    if (pStream->pMaster != (TFileStream *)0x0) {
      FileStream_Close(pStream->pMaster);
    }
    pStream->pMaster = (TFileStream *)0x0;
    p_Var1 = pStream->StreamClose;
    if ((p_Var1 != (STREAM_CLOSE)0x0) || (p_Var1 = pStream->BaseClose, p_Var1 != (STREAM_CLOSE)0x0))
    {
      (*p_Var1)(pStream);
    }
    free(pStream);
    return;
  }
  return;
}

Assistant:

void FileStream_Close(TFileStream * pStream)
{
    // Check if the stream structure is allocated at all
    if(pStream != NULL)
    {
        // Free the master stream, if any
        if(pStream->pMaster != NULL)
            FileStream_Close(pStream->pMaster);
        pStream->pMaster = NULL;

        // Close the stream provider.
        if(pStream->StreamClose != NULL)
            pStream->StreamClose(pStream);

        // Also close base stream, if any
        else if(pStream->BaseClose != NULL)
            pStream->BaseClose(pStream);

        // Free the stream itself
        CASC_FREE(pStream);
    }
}